

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O2

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5>::
ConcreteMachine(ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *this,Target *target
               ,ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  AY38910<false> *this_01;
  CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle> *this_02;
  Struct *pSVar1;
  bool bVar2;
  iterator iVar3;
  Joystick *pJVar4;
  undefined4 *puVar5;
  size_t sVar6;
  State *state;
  Name rom_name;
  Processor<Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5>,_false,_false>
  *local_d8;
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>,_false>
  *local_d0;
  AsyncTaskQueue<false,_true,_void> *local_c8;
  JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1> *local_c0;
  BinaryTapePlayer *local_b8;
  JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
  *local_b0;
  CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle> *local_a8;
  TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper> *local_a0;
  MappedKeyboardMachine *local_98;
  Joystick *local_90;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_0057cd40;
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR___cxa_pure_virtual_0058b7b0;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR___cxa_pure_virtual_00584df0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_0058b7c8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  (this->super_JoystickMachine)._vptr_JoystickMachine =
       (_func_int **)&PTR___cxa_pure_virtual_0057cd70;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roms._M_t._M_impl.super__Rb_tree_header._M_header;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_0057d680;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_0057d600;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d638;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  roms._M_t._M_impl._0_4_ = 2;
  local_98 = &this->super_MappedKeyboardMachine;
  Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::
  TypeRecipient<Sinclair::ZX::Keyboard::Machine>
            (&this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>,(Machine *)&roms);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_0058ca10;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_0058cae0;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0058caf8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0058cb18;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0058cb48;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0058cb60;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0058cb78;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0058cba8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0058cbe8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0058cc00;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0058cc38;
  (this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).super_Delegate.
  super_KeyActions._vptr_KeyActions = (_func_int **)&PTR_set_key_state_0058cc80;
  local_d8 = &this->z80_;
  local_a0 = &this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>;
  CPU::Z80::
  Processor<Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5>,_false,_false>
  ::Processor(local_d8,this);
  this->port1ffd_ = '\0';
  this->port7ffd_ = '\0';
  this->disable_paging_ = false;
  this_00 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  this_01 = &this->ay_;
  local_c8 = this_00;
  GI::AY38910::AY38910<false>::AY38910SampleSource(this_01,AY38910,this_00);
  Audio::Toggle::Toggle(&this->audio_toggle_,local_c8);
  this_02 = &this->mixer_;
  Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>::CompoundSource
            (this_02,this_01,&this->audio_toggle_);
  local_d0 = &(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>,_false>
  ;
  local_a8 = this_02;
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>::
  PullLowpass((PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>
               *)local_d0,this_02);
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
  ::JustInTimeActor<>(&this->video_);
  local_b0 = &this->video_;
  ZX::Keyboard::Keyboard::Keyboard(&this->keyboard_,ZXSpectrum);
  ZX::Keyboard::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_,ZXSpectrum);
  local_b8 = &this->tape_player_;
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(local_b8,0x6c3df6);
  this->tape_player_is_sleeping_ = false;
  this->use_automatic_tape_motor_control_ = true;
  (this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>.length_ = 0;
  *(undefined8 *)
   ((long)&(this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>.length_ + 6) = 0;
  roms._M_t._M_impl._0_4_ = 0x6c3df6;
  JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::JustInTimeActor<unsigned_int>
            (&this->fdc_,(uint *)&roms);
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_ = 0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TimedMachine).clock_rate_ = 3546875.0;
  local_c0 = &this->fdc_;
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>,_false>
  ::set_input_rate(local_d0,1773437.5);
  rom_name = SpectrumPlus3;
  ROM::Request::Request(&request,SpectrumPlus3,false);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,rom_fetcher,&request);
  bVar2 = ROM::Request::validate(&request,&roms);
  if (bVar2) {
    iVar3 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&rom_name);
    sVar6 = (long)iVar3._M_node[1]._M_left - (long)iVar3._M_node[1]._M_parent;
    if (0xffff < sVar6) {
      sVar6 = 0x10000;
    }
    memcpy(&this->rom_,iVar3._M_node[1]._M_parent,sVar6);
    (this->tape_player_).super_TapePlayer.super_Source.observer_ = &this->super_Observer;
    ClockingHint::Source::update_clocking_observer
              (&(this->tape_player_).super_TapePlayer.super_Source);
    pJVar4 = (Joystick *)operator_new(0x48);
    anon_unknown.dwarf_d960c9::Joystick::Joystick(pJVar4);
    local_90 = pJVar4;
    std::
    vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
    ::emplace_back<(anonymous_namespace)::Joystick*>
              ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
                *)&this->joysticks_,&local_90);
    pJVar4 = (Joystick *)operator_new(0x48);
    anon_unknown.dwarf_d960c9::Joystick::Joystick(pJVar4);
    local_90 = pJVar4;
    std::
    vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
    ::emplace_back<(anonymous_namespace)::Joystick*>
              ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
                *)&this->joysticks_,&local_90);
    update_memory_map(this);
    set_video_address(this);
    Memory::Fuzz<std::array<unsigned_char,131072ul>>(&this->ram_);
    (*(this->super_Source)._vptr_Source[0x10])(this,&(target->super_Target).media);
    if (target->should_hold_enter == true) {
      (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_ = 0x10e9ae7;
      ZX::Keyboard::Keyboard::set_key_state(&this->keyboard_,0x601,true);
    }
    pSVar1 = (target->super_Target).state._M_t.
             super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>.
             _M_t.
             super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
             super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl;
    if (pSVar1 != (Struct *)0x0) {
      CPU::Z80::State::apply((State *)(pSVar1 + 1),&local_d8->super_ProcessorBase);
      ZXSpectrum::Video::State::
      apply<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>>
                ((State *)(pSVar1 + 0xf),&(this->video_).object_);
      GI::AY38910::State::apply<GI::AY38910::AY38910<false>>((State *)(pSVar1 + 0x17),this_01);
      sVar6 = (long)pSVar1[0x14]._vptr_Struct - (long)pSVar1[0x13]._vptr_Struct;
      if (0x1ffff < sVar6) {
        sVar6 = 0x20000;
      }
      memcpy(&this->ram_,pSVar1[0x13]._vptr_Struct,sVar6);
      this->port1ffd_ = *(uint8_t *)&pSVar1[0x1b]._vptr_Struct;
      this->port7ffd_ = *(uint8_t *)&pSVar1[0x16]._vptr_Struct;
      update_memory_map(this);
    }
    std::
    _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~_Rb_tree(&roms._M_t);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&request.node.children);
    return;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Analyser::Static::ZXSpectrum::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			Utility::TypeRecipient<CharacterMapper>(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			z80_(*this),
			ay_(GI::AY38910::Personality::AY38910, audio_queue_),
			audio_toggle_(audio_queue_),
			mixer_(ay_, audio_toggle_),
			speaker_(mixer_),
			keyboard_(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			keyboard_mapper_(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			tape_player_(clock_rate() * 2),
			fdc_(clock_rate() * 2)
		{
			set_clock_rate(clock_rate());
			speaker_.set_input_rate(float(clock_rate()) / 2.0f);

			ROM::Name rom_name;
			switch(model) {
				case Model::SixteenK:
				case Model::FortyEightK:	rom_name = ROM::Name::Spectrum48k;		break;
				case Model::OneTwoEightK:	rom_name = ROM::Name::Spectrum128k;		break;
				case Model::Plus2:			rom_name = ROM::Name::SpecrumPlus2;		break;
				case Model::Plus2a:
				case Model::Plus3:			rom_name = ROM::Name::SpectrumPlus3;	break;
				// TODO: possibly accept the +3 ROM in multiple parts?
			}
			const auto request = ROM::Request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			const auto &rom = roms.find(rom_name)->second;
			memcpy(rom_.data(), rom.data(), std::min(rom_.size(), rom.size()));

			// Register for sleeping notifications.
			tape_player_.set_clocking_hint_observer(this);

			// Attach a couple of joysticks.
			joysticks_.emplace_back(new Joystick);
			joysticks_.emplace_back(new Joystick);

			// Set up initial memory map.
			update_memory_map();
			set_video_address();
			Memory::Fuzz(ram_);

			// Insert media.
			insert_media(target.media);

			// Possibly depress the enter key.
			if(target.should_hold_enter) {
				// Hold it for five seconds, more or less.
				duration_to_press_enter_ = Cycles(5 * clock_rate());
				keyboard_.set_key_state(ZX::Keyboard::KeyEnter, true);
			}

			// Install state if supplied.
			if(target.state) {
				const auto state = static_cast<State *>(target.state.get());
				state->z80.apply(z80_);
				state->video.apply(*video_.last_valid());
				state->ay.apply(ay_);

				// If this is a 48k or 16k machine, remap source data from its original
				// linear form to whatever the banks end up being; otherwise copy as is.
				if(model <= Model::FortyEightK) {
					const size_t num_banks = std::min(size_t(48*1024), state->ram.size()) >> 14;
					for(size_t c = 0; c < num_banks; c++) {
						memcpy(&banks_[c + 1].write[(c+1) * 0x4000], &state->ram[c * 0x4000], 0x4000);
					}
				} else {
					memcpy(ram_.data(), state->ram.data(), std::min(ram_.size(), state->ram.size()));

					port1ffd_ = state->last_1ffd;
					port7ffd_ = state->last_7ffd;
					update_memory_map();
				}
			}
		}